

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::pushPrototypeInputs(PrintC *this,FuncProto *proto)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator local_179;
  string local_178 [32];
  Atom local_158;
  allocator local_129;
  string local_128 [32];
  Atom local_108;
  allocator local_d9;
  string local_d8 [32];
  Atom local_b8;
  ProtoParameter *local_90;
  ProtoParameter *param;
  int local_80;
  int4 i_1;
  int4 i;
  allocator local_69;
  string local_68 [32];
  Atom local_48;
  int4 local_1c;
  FuncProto *pFStack_18;
  int4 sz;
  FuncProto *proto_local;
  PrintC *this_local;
  
  pFStack_18 = proto;
  proto_local = (FuncProto *)this;
  local_1c = FuncProto::numParams(proto);
  if ((local_1c != 0) || (bVar1 = FuncProto::isDotdotdot(pFStack_18), bVar1)) {
    for (local_80 = 0; local_80 < local_1c + -1; local_80 = local_80 + 1) {
      PrintLanguage::pushOp(&this->super_PrintLanguage,&comma,(PcodeOp *)0x0);
    }
    bVar1 = FuncProto::isDotdotdot(pFStack_18);
    if ((bVar1) && (local_1c != 0)) {
      PrintLanguage::pushOp(&this->super_PrintLanguage,&comma,(PcodeOp *)0x0);
    }
    for (param._4_4_ = 0; param._4_4_ < local_1c; param._4_4_ = param._4_4_ + 1) {
      local_90 = FuncProto::getParam(pFStack_18,param._4_4_);
      iVar2 = (*local_90->_vptr_ProtoParameter[3])();
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6e])(this,CONCAT44(extraout_var,iVar2),1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"",&local_d9);
      PrintLanguage::Atom::Atom(&local_b8,(string *)local_d8,blanktoken,no_color);
      PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_b8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      iVar2 = (*local_90->_vptr_ProtoParameter[3])();
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6f])(this,CONCAT44(extraout_var_00,iVar2))
      ;
    }
    bVar1 = FuncProto::isDotdotdot(pFStack_18);
    if (bVar1) {
      if (local_1c == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_178,"",&local_179);
        PrintLanguage::Atom::Atom(&local_158,(string *)local_178,blanktoken,no_color);
        PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_158);
        std::__cxx11::string::~string(local_178);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_128,"...",&local_129);
        PrintLanguage::Atom::Atom(&local_108,(string *)local_128,syntax,no_color);
        PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_108);
        std::__cxx11::string::~string(local_128);
        std::allocator<char>::~allocator((allocator<char> *)&local_129);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"void",&local_69);
    PrintLanguage::Atom::Atom(&local_48,(string *)local_68,syntax,keyword_color);
    PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  return;
}

Assistant:

void PrintC::pushPrototypeInputs(const FuncProto *proto)

{
  int4 sz = proto->numParams();

  if ((sz == 0)&&(!proto->isDotdotdot()))
    pushAtom(Atom("void",syntax,EmitXml::keyword_color));
  else {
    for(int4 i=0;i<sz-1;++i)
      pushOp(&comma,(const PcodeOp *)0); // Print a comma for each parameter (above 1)
    if (proto->isDotdotdot()&&(sz!=0)) // Print comma for dotdotdot (if it is not by itself)
      pushOp(&comma,(const PcodeOp *)0);
    for(int4 i=0;i<sz;++i) {
      ProtoParameter *param = proto->getParam(i);
      pushTypeStart(param->getType(),true);
      pushAtom(Atom("",blanktoken,EmitXml::no_color));
      pushTypeEnd(param->getType());
    }
    if (proto->isDotdotdot()) {
      if (sz != 0)
	pushAtom(Atom("...",syntax,EmitXml::no_color));
      else {
	// In ANSI C, a prototype with empty parens means the parameters are unspecified (not void)
	// In C++, empty parens mean void, we use the ANSI C convention
	pushAtom(Atom("",blanktoken,EmitXml::no_color)); // An empty list of parameters
      }
    }
  }
}